

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzerResults.cpp
# Opt level: O3

void __thiscall
I2sAnalyzerResults::GenerateBubbleText
          (I2sAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  I2sAnalyzerSettings *pIVar1;
  Frame frame;
  char number_str [128];
  stringstream ss;
  Frame local_270 [16];
  ulonglong local_260;
  undefined1 local_250;
  char *local_248;
  char local_238 [16];
  char local_228 [128];
  stringstream local_1a8 [16];
  undefined1 local_198 [112];
  ios_base local_128 [264];
  
  AnalyzerResults::ClearResultStrings();
  AnalyzerResults::GetFrame((ulonglong)local_270);
  switch(local_250) {
  case 0:
    pIVar1 = this->mSettings;
    if ((display_base == Decimal) && (pIVar1->mSigned == SignedInteger)) {
      AnalyzerHelpers::ConvertToSignedNumber(local_260,pIVar1->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::ostream::_M_insert<long_long>((longlong)local_198);
      std::__cxx11::stringbuf::str();
      strcpy(local_228,local_248);
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    else {
      AnalyzerHelpers::GetNumberString(local_260,display_base,pIVar1->mBitsPerWord,local_228,0x80);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 1",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 1: ",local_228,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 1:
    pIVar1 = this->mSettings;
    if ((display_base == Decimal) && (pIVar1->mSigned == SignedInteger)) {
      AnalyzerHelpers::ConvertToSignedNumber(local_260,pIVar1->mBitsPerWord);
      std::__cxx11::stringstream::stringstream(local_1a8);
      std::ostream::_M_insert<long_long>((longlong)local_198);
      std::__cxx11::stringbuf::str();
      strcpy(local_228,local_248);
      if (local_248 != local_238) {
        operator_delete(local_248);
      }
      std::__cxx11::stringstream::~stringstream(local_1a8);
      std::ios_base::~ios_base(local_128);
    }
    else {
      AnalyzerHelpers::GetNumberString(local_260,display_base,pIVar1->mBitsPerWord,local_228,0x80);
    }
    AnalyzerResults::AddResultString
              ((char *)this,"2",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 2",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Ch 2: ",local_228,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    sprintf((char *)local_1a8,"%d",(ulong)this->mSettings->mBitsPerWord);
    AnalyzerResults::AddResultString
              ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: too few bits",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: too few bits, expecting ",(char *)local_1a8,(char *)0x0,
               (char *)0x0,(char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddResultString
              ((char *)this,"!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: bits don\'t divide evenly",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Error: bits don\'t divide evenly between subframes",(char *)0x0,
               (char *)0x0,(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_270);
  return;
}

Assistant:

void I2sAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                             DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    ClearResultStrings();
    Frame frame = GetFrame( frame_index );

    switch( I2sResultType( frame.mType ) )
    {
    case Channel1:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }
        AddResultString( "1" );
        AddResultString( "Ch 1" );
        AddResultString( "Ch 1: ", number_str );
    }
    break;
    case Channel2:
    {
        char number_str[ 128 ];
        if( ( display_base == Decimal ) && ( mSettings->mSigned == AnalyzerEnums::SignedInteger ) )
        {
            S64 signed_number = AnalyzerHelpers::ConvertToSignedNumber( frame.mData1, mSettings->mBitsPerWord );
            std::stringstream ss;
            ss << signed_number;
            strcpy( number_str, ss.str().c_str() );
        }
        else
        {
            AnalyzerHelpers::GetNumberString( frame.mData1, display_base, mSettings->mBitsPerWord, number_str, 128 );
        }
        AddResultString( "2" );
        AddResultString( "Ch 2" );
        AddResultString( "Ch 2: ", number_str );
    }
    break;
    case ErrorTooFewBits:
    {
        char bits_per_word[ 32 ];
        sprintf( bits_per_word, "%d", mSettings->mBitsPerWord );

        AddResultString( "!" );
        AddResultString( "Error" );
        AddResultString( "Error: too few bits" );
        AddResultString( "Error: too few bits, expecting ", bits_per_word );
    }
    break;
    case ErrorDoesntDivideEvenly:
    {
        AddResultString( "!" );
        AddResultString( "Error" );
        AddResultString( "Error: bits don't divide evenly" );
        AddResultString( "Error: bits don't divide evenly between subframes" );
    }
    break;
    }
}